

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

logic_t __thiscall slang::SVInt::reductionOr(SVInt *this)

{
  ulong *puVar1;
  bool bVar2;
  uint uVar3;
  uint64_t *puVar4;
  long lVar5;
  ulong uVar6;
  uint32_t i;
  ulong uVar7;
  
  bVar2 = (this->super_SVIntStorage).unknownFlag;
  uVar3 = (this->super_SVIntStorage).bitWidth;
  if (bVar2 == true) {
    uVar6 = (ulong)(uVar3 + 0x3f >> 6);
    puVar4 = (this->super_SVIntStorage).field_0.pVal;
    uVar7 = 0;
    do {
      if (uVar6 == uVar7) {
        return (logic_t)0x80;
      }
      lVar5 = uVar6 + uVar7;
      puVar1 = puVar4 + uVar7;
      uVar7 = uVar7 + 1;
    } while ((*puVar1 & ~puVar4[lVar5]) == 0);
  }
  else {
    if (uVar3 < 0x41) {
      return (logic_t)((this->super_SVIntStorage).field_0.val != 0);
    }
    uVar7 = 0;
    do {
      if ((uVar3 + 0x3f >> 6) << (bVar2 & 0x1fU) == uVar7) {
        return (logic_t)'\0';
      }
      puVar4 = (this->super_SVIntStorage).field_0.pVal + uVar7;
      uVar7 = uVar7 + 1;
    } while (*puVar4 == 0);
  }
  return (logic_t)'\x01';
}

Assistant:

logic_t SVInt::reductionOr() const {
    if (unknownFlag) {
        uint32_t words = getNumWords(bitWidth, false);
        for (uint32_t i = 0; i < words; i++) {
            if (pVal[i] & ~pVal[i + words])
                return logic_t(true);
        }
        return logic_t::x;
    }

    if (isSingleWord())
        return logic_t(val != 0);
    else {
        for (uint32_t i = 0; i < getNumWords(); i++) {
            if (pVal[i] != 0)
                return logic_t(true);
        }
    }
    return logic_t(false);
}